

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O1

void test_font_props(wins *wins_ar,int ar_len)

{
  Am_Font_Family_Flag AVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  ulong local_70;
  ulong local_68;
  int max_char_descent;
  int max_char_ascent;
  long local_50;
  long local_48;
  Am_Font local_40 [8];
  int min_char_width;
  int max_char_width;
  
  test_string = "Egypt";
  test_str_len = 5;
  local_70 = 0;
  do {
    local_68 = 0;
    do {
      local_50 = 0;
      do {
        AVar1 = test_font_variety::family_array[local_50];
        lVar3 = 0;
        do {
          Am_Font::Am_Font(local_40,AVar1,(int)local_70 != 0,(int)local_68 != 0,false,
                           test_font_variety::size_array[lVar3]);
          Am_Font::operator=((Am_Font *)&test_font,local_40);
          local_48 = lVar3;
          Am_Font::~Am_Font(local_40);
          if (0 < ar_len) {
            lVar3 = 0;
            do {
              plVar2 = *(long **)((long)&wins_ar->font_win + lVar3);
              (**(code **)(*plVar2 + 0xd8))
                        (plVar2,&test_font,&max_char_width,&min_char_width,&max_char_ascent,
                         &max_char_descent);
              (**(code **)(*plVar2 + 0xd0))
                        (plVar2,&test_font,test_string,test_str_len,&test_string_width,
                         &test_string_ascent,&test_string_descent,&test_string_left_bearing,
                         &test_string_right_bearing);
              test_string_height = test_string_descent + test_string_ascent;
              if ((max_char_ascent < test_string_ascent) || (max_char_descent < test_string_descent)
                 ) {
                printf("test_font_props() failed:  bold=%d, ital=%d, fam=%d, size=%d\n",local_70,
                       local_68,local_50,local_48);
                exit(-1);
              }
              lVar3 = lVar3 + 0x40;
            } while ((ulong)(uint)ar_len << 6 != lVar3);
          }
          lVar3 = local_48 + 1;
        } while (lVar3 != 4);
        local_50 = local_50 + 1;
      } while (local_50 != 3);
      bVar4 = (int)local_68 == 0;
      local_68 = (ulong)((int)local_68 + 1);
    } while (bVar4);
    bVar4 = (int)local_70 != 0;
    local_70 = (ulong)((int)local_70 + 1);
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void
test_font_props(wins *wins_ar, int ar_len)
{
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[4] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_LARGE, Am_FONT_VERY_LARGE};
  test_string = "Egypt";
  test_str_len = 5;
  for (int bold = 0; bold < 2; bold++) {
    for (int ital = 0; ital < 2; ital++) {
      for (int fam = 0; fam < 3; fam++) {
        for (int size = 0; size < 4; size++) {
          int max_char_width, min_char_width, max_char_ascent, max_char_descent;
          test_font =
              Am_Font(family_array[fam], bold, ital, false, size_array[size]);
          for (int i = 0; i < ar_len; i++) {
            Am_Drawonable *font_win = wins_ar[i].font_win;
            font_win->Get_Font_Properties(test_font, max_char_width,
                                          min_char_width, max_char_ascent,
                                          max_char_descent);
            update_font_numbers(font_win);
            if ((test_string_ascent > max_char_ascent) ||
                (test_string_descent > max_char_descent)) {
              //(test_string_width   < (test_str_len * min_char_width)) || //under Windows, we get aver. char. width
              //as min. char. width
              //(test_string_width   > (test_str_len * max_char_width)))
              printf("test_font_props() failed:  bold=%d, ital=%d, fam=%d, "
                     "size=%d\n",
                     bold, ital, fam, size);
              exit(-1);
            }
          }
        }
      }
    }
  }
  //  fprintf(stderr, "test_font_props() passed all standard font tests.\n");
}